

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

void ec2AddALD(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  bool_t bVar1;
  size_t *b_00;
  size_t *psVar2;
  long in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *t4;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  size_t *a_00;
  ec_o *ec_00;
  word *b_01;
  
  b_01 = *(word **)(*(long *)(in_RCX + 0x18) + 0x30);
  ec_00 = (ec_o *)(in_R8 + (long)b_01);
  a_00 = &(ec_00->hdr).keep + (long)b_01;
  b_00 = a_00 + (long)b_01;
  psVar2 = b_00 + (long)b_01;
  bVar1 = wwIsZero(in_RSI + (long)b_01 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
  if (bVar1 == 0) {
    (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
              (in_R8,in_RSI + (long)b_01 * 2,*(undefined8 *)(in_RCX + 0x18),psVar2);
    (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
              (in_R8,in_RDX + (long)b_01,in_R8,*(undefined8 *)(in_RCX + 0x18),psVar2);
    wwXor2(in_R8,in_RSI + (long)b_01,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
              (ec_00,in_RDX,in_RSI + (long)b_01 * 2,*(undefined8 *)(in_RCX + 0x18),psVar2);
    wwXor2((word *)ec_00,in_RSI,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    bVar1 = wwIsZero((word *)ec_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    if (bVar1 == 0) {
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (a_00,ec_00,in_RSI + (long)b_01 * 2,*(undefined8 *)(in_RCX + 0x18),psVar2);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (in_RDI + (long)b_01 * 2,a_00,*(undefined8 *)(in_RCX + 0x18),psVar2);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (b_00,in_RDX,in_RDI + (long)b_01 * 2,*(undefined8 *)(in_RCX + 0x18),psVar2);
      wwXor(in_RDI + (long)b_01,in_RDX,in_RDX + (long)b_01,
            *(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (in_RDI,ec_00,*(undefined8 *)(in_RCX + 0x18),psVar2);
      wwXor2(in_RDI,in_R8,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      bVar1 = wwEq(*(word **)(in_RCX + 0x20),*(word **)(*(long *)(in_RCX + 0x18) + 0x20),
                   *(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      if (bVar1 == 0) {
        bVar1 = wwIsZero(*(word **)(in_RCX + 0x20),*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        if (bVar1 == 0) {
          (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                    (ec_00,*(undefined8 *)(in_RCX + 0x20),a_00,*(undefined8 *)(in_RCX + 0x18),psVar2
                    );
          wwXor2(in_RDI,(word *)ec_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        }
      }
      else {
        wwXor2(in_RDI,a_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      }
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (in_RDI,in_RDI,a_00,*(undefined8 *)(in_RCX + 0x18),psVar2);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (ec_00,in_R8,*(undefined8 *)(in_RCX + 0x18),psVar2);
      wwXor2(in_RDI,(word *)ec_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (ec_00,in_RDI + (long)b_01 * 2,*(undefined8 *)(in_RCX + 0x18),psVar2);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (in_RDI + (long)b_01,in_RDI + (long)b_01,ec_00,*(undefined8 *)(in_RCX + 0x18),psVar2
                );
      wwXor2(b_00,in_RDI,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (in_R8,in_R8,a_00,*(undefined8 *)(in_RCX + 0x18),psVar2);
      wwXor2(in_R8,in_RDI + (long)b_01 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (in_R8,in_R8,b_00,*(undefined8 *)(in_RCX + 0x18),psVar2);
      wwXor2(in_RDI + (long)b_01,in_R8,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    }
    else {
      bVar1 = wwIsZero(in_R8,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      if (bVar1 == 0) {
        wwSetZero(in_RDI + (long)b_01 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      }
      else {
        ec2DblALD(b_01,in_R8,ec_00,a_00);
      }
    }
  }
  else {
    wwCopy(in_RDI,in_RDX,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    wwCopy(in_RDI + (long)b_01,in_RDX + (long)b_01,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    wwCopy(in_RDI + (long)b_01 * 2,*(word **)(*(long *)(in_RCX + 0x18) + 0x20),
           *(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
  }
  return;
}

Assistant:

static void ec2AddALD(word c[], const word a[], const word b[],
	const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	stack = t4 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(ec2SeemsOnA(b, ec));
	ASSERT(wwIsSameOrDisjoint(a,  c, 3 * n));
	ASSERT(b == c || wwIsDisjoint2(b, 2 * n, c, 3 * n));
	// a == O => c <- (xb : yb : 1)
	if (qrIsZero(ecZ(a, n), ec->f))
	{
		qrCopy(ecX(c), ecX(b), ec->f);
		qrCopy(ecY(c, n), ecY(b, n), ec->f);
		qrSetUnity(ecZ(c, n), ec->f);
		return;
	}
	// t1 <- ya + yb za^2 [A]
	qrSqr(t1, ecZ(a, n), ec->f, stack);
	qrMul(t1, ecY(b, n), t1, ec->f, stack);
	gf2Add2(t1, ecY(a, n), ec->f);
	// t2 <- xa + xb za [B]
	qrMul(t2, ecX(b), ecZ(a, n), ec->f, stack);
	gf2Add2(t2, ecX(a), ec->f);
	// t2 == 0 => a == \pm b
	if (qrIsZero(t2, ec->f))
	{
		// t1 == 0 => a == b => c <- 2b
		if (qrIsZero(t1, ec->f))
			ec2DblALD(c, b, ec, stack);
		// t1 != 0 => a == -b => c <- O
		else
			qrSetZero(ecZ(c, n), ec->f);
		return;
	}
	// t3 <- t2 za [C]
	qrMul(t3, t2, ecZ(a, n), ec->f, stack);
	// zc <- t3^2 [C^2]
	qrSqr(ecZ(c, n), t3, ec->f, stack);
	// t4 <- xb zc [D]
	qrMul(t4, ecX(b), ecZ(c, n), ec->f, stack);
	// yc <- xb + yb [X2 + Y2]
	gf2Add(ecY(c, n), ecX(b), ecY(b, n), ec->f);
	// xc <- t2^2 + t1 + A t3 [B^2 + A + a2 * C]
	qrSqr(ecX(c), t2, ec->f, stack);
	gf2Add2(ecX(c), t1, ec->f);
	if (qrIsUnity(ec->A, ec->f))
		gf2Add2(ecX(c), t3, ec->f);
	else if (!qrIsZero(ec->A, ec->f))
	{
		qrMul(t2, ec->A, t3, ec->f, stack);
		gf2Add2(ecX(c), t2, ec->f);
	}
	// xc <- xc t3 + t1^2 [C * (A + B^2 + a2 * C) + A^2]
	qrMul(ecX(c), ecX(c), t3, ec->f, stack);
	qrSqr(t2, t1, ec->f, stack);
	gf2Add2(ecX(c), t2, ec->f);
	// yc <- yc zc^2 [(Y2 + X2) * Z3^2]
	qrSqr(t2, ecZ(c, n), ec->f, stack);
	qrMul(ecY(c, n), ecY(c, n), t2, ec->f, stack);
	// t4 <- t4 + xc [D + X3]
	gf2Add2(t4, ecX(c), ec->f);
	// t1 <- t1 t3 + zc [A * C + Z3]
	qrMul(t1, t1, t3, ec->f, stack);
	gf2Add2(t1, ecZ(c, n), ec->f);
	// t1 <- t1 t4 [(D + X3)(A * C + Z3)]
	qrMul(t1, t1, t4, ec->f, stack);
	// yc <- yc + t1 [(D + X3)(A * C + Z3) + (Y2 + X2) * Z3^2]
	gf2Add2(ecY(c, n), t1, ec->f);
}